

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O2

Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
llbuild::commands::util::readFileContents(StringRef filename)

{
  storage_type *Val;
  long in_RDX;
  error_category *peVar1;
  undefined8 extraout_RDX;
  anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  this;
  error_code eVar2;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EVar3;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  ulong local_270;
  error_code ec;
  string local_258;
  string local_238;
  Twine local_218;
  Twine local_200;
  Twine local_1e8;
  Twine local_1d0;
  Twine local_1b8;
  Twine local_1a0;
  Twine local_188;
  Twine local_170;
  Twine local_158;
  SmallString<256U> path;
  
  this = (anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
          )filename.Data;
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&path.super_SmallVector<char,_256U>,(char *)filename.Length,
             (char *)filename.Length + in_RDX);
  llvm::sys::fs::make_absolute(&path.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>);
  llvm::Twine::Twine((Twine *)&local_258,
                     &path.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>);
  llvm::MemoryBuffer::getFile(&bufferOrError,(Twine *)&local_258,-1,true,false);
  if ((bufferOrError._16_1_ & 1) == 0) {
    Val = llvm::
          ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
          getStorage(&bufferOrError);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
              ((Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)this,Val,(type *)0x0);
  }
  else {
    eVar2 = llvm::
            ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            ::getError(&bufferOrError);
    peVar1 = eVar2._M_cat;
    ec._M_value = eVar2._M_value;
    ec._M_cat = peVar1;
    llvm::Twine::Twine(&local_1b8,"unable to read input \"");
    escapedString_abi_cxx11_
              ((StringRef)
               bufferOrError.field_0.ErrorStorage.super_AlignedCharArray<8UL,_16UL>.buffer);
    llvm::Twine::Twine(&local_1d0,&local_258);
    llvm::Twine::concat(&local_1a0,&local_1b8,&local_1d0);
    llvm::Twine::Twine(&local_1e8,"\" (");
    llvm::Twine::concat(&local_188,&local_1a0,&local_1e8);
    (**(code **)(*(long *)peVar1 + 0x20))(&local_238,peVar1,eVar2._M_value);
    llvm::Twine::Twine(&local_200,&local_238);
    llvm::Twine::concat(&local_170,&local_188,&local_200);
    llvm::Twine::Twine(&local_218,")");
    llvm::Twine::concat(&local_158,&local_170,&local_218);
    llvm::make_error<llvm::StringError,llvm::Twine,std::error_code&>
              ((llvm *)&local_270,&local_158,&ec);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)this,(Error *)&local_270);
    if ((long *)(local_270 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_270 & 0xfffffffffffffffe) + 8))();
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~ErrorOr(&bufferOrError);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&path);
  EVar3._8_8_ = extraout_RDX;
  EVar3.field_0 = this;
  return EVar3;
}

Assistant:

llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>> util::readFileContents(
    StringRef filename) {
  SmallString<256> path(filename);
  llvm::sys::fs::make_absolute(path);

  auto bufferOrError = llvm::MemoryBuffer::getFile(path);
  if (!bufferOrError) {
    auto ec = bufferOrError.getError();
    return llvm::make_error<llvm::StringError>(
        Twine("unable to read input \"") + util::escapedString(path) +
        "\" (" + ec.message() + ")", ec);
  }
  return std::move(*bufferOrError);
}